

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __thiscall
async_simple::coro::detail::
LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::awaitResume
          (LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
           *this)

{
  undefined8 uVar1;
  duration<long,_std::ratio<1L,_1000L>_> dVar2;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *ppVar3;
  coroutine_handle<async_simple::coro::detail::LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
  *pcVar4;
  LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_> *in_RDI;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> pVar5;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> r;
  LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_> *this_00;
  undefined1 local_18;
  
  this_00 = in_RDI;
  std::
  coroutine_handle<async_simple::coro::detail::LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
  ::promise((coroutine_handle<async_simple::coro::detail::LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
             *)in_RDI);
  ppVar3 = LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::
           result(this_00);
  uVar1 = *(undefined8 *)ppVar3;
  dVar2.__r = (ppVar3->second).__r;
  std::
  coroutine_handle<async_simple::coro::detail::LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
  ::destroy((coroutine_handle<async_simple::coro::detail::LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
             *)0x45cf42);
  pcVar4 = std::
           coroutine_handle<async_simple::coro::detail::LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
           ::operator=((coroutine_handle<async_simple::coro::detail::LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
                        *)in_RDI,(nullptr_t)0x0);
  local_18 = (undefined1)uVar1;
  pVar5._1_7_ = (undefined7)((ulong)pcVar4 >> 8);
  pVar5.first = (bool)local_18;
  pVar5.second.__r = dVar2.__r;
  return pVar5;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }